

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadAnimation(OgreBinarySerializer *this,Animation *anim)

{
  uint16_t uVar1;
  ulong uVar2;
  float fVar3;
  VertexAnimationTrack track;
  
  if (*(int *)&this->m_reader->end != *(int *)&this->m_reader->current) {
    uVar1 = ReadHeader(this,true);
    if (uVar1 == 0xd105) {
      ReadLine_abi_cxx11_((string *)&track,this);
      std::__cxx11::string::operator=((string *)&anim->baseName,(string *)&track);
      std::__cxx11::string::~string((string *)&track);
      fVar3 = Read<float>(this);
      anim->baseTime = fVar3;
      uVar1 = ReadHeader(this,true);
    }
    while( true ) {
      uVar2 = (long)this->m_reader->end - (long)this->m_reader->current;
      if ((uVar1 != 0xd110) || ((uVar2 & 0xffffffff) == 0)) break;
      VertexAnimationTrack::VertexAnimationTrack(&track);
      uVar1 = Read<unsigned_short>(this);
      track.type = (Type)uVar1;
      track.target = Read<unsigned_short>(this);
      ReadAnimationKeyFrames(this,anim,&track);
      std::
      vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
      ::push_back(&anim->tracks,&track);
      if (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current) {
        uVar1 = 0xd110;
      }
      else {
        uVar1 = ReadHeader(this,true);
      }
      VertexAnimationTrack::~VertexAnimationTrack(&track);
    }
    if ((int)uVar2 != 0) {
      RollbackHeader(this);
    }
  }
  return;
}

Assistant:

bool OgreBinarySerializer::AtEnd() const
{
    return (m_reader->GetRemainingSize() == 0);
}